

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_rkv_reg.c
# Opt level: O0

MPP_RET rkv_h264d_gen_regs(void *hal,HalTaskInfo *task)

{
  RK_U64 *data;
  int iVar1;
  uint local_38;
  uint local_34;
  RK_U32 i;
  RK_U32 i_1;
  H264dRkvRegCtx_t *reg_ctx;
  H264dHalCtx_t *p_hal;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  if (hal == (void *)0x0) {
    if ((hal_h264d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264d_rkv_reg","input empty(%d).\n",(char *)0x0,0x278);
    }
  }
  else if ((((task->dec).flags.val >> 2 & 1) == 0) &&
          ((((task->dec).flags.val >> 3 & 1) == 0 ||
           (*(int *)(*(long *)((long)hal + 0x60) + 0x30) != 0)))) {
    data = *(RK_U64 **)((long)hal + 0x90);
    if (*(int *)((long)hal + 0x98) != 0) {
      for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
        if ((int)data[(ulong)local_34 * 5 + 0x52] == 0) {
          (task->dec).reg_index = local_34;
          data[0x61] = data[(ulong)local_34 * 5 + 0x53];
          data[0x62] = data[(ulong)local_34 * 5 + 0x54];
          data[99] = data[(ulong)local_34 * 5 + 0x55];
          data[100] = data[(ulong)local_34 * 5 + 0x56];
          *(undefined4 *)(data + (ulong)local_34 * 5 + 0x52) = 1;
          break;
        }
      }
    }
    prepare_spspps((H264dHalCtx_t *)hal,data,0x20);
    prepare_framerps((H264dHalCtx_t *)hal,data + 4,0x100);
    prepare_scanlist((H264dHalCtx_t *)hal,data + 0x24,0x160);
    set_registers((H264dHalCtx_t *)hal,(H264dRkvRegs_t *)data[100],task);
    for (local_38 = 0; local_38 < 0x100; local_38 = local_38 + 1) {
      mpp_buffer_write_with_caller
                ((MppBuffer)data[0x61],(ulong)local_38 << 5,data,0x20,"rkv_h264d_gen_regs");
    }
    iVar1 = mpp_buffer_get_fd_with_caller((MppBuffer)data[0x61],"rkv_h264d_gen_regs");
    *(int *)(data[100] + 0xa8) = iVar1;
    mpp_buffer_write_with_caller((MppBuffer)data[0x62],0,data + 4,0x100,"rkv_h264d_gen_regs");
    iVar1 = mpp_buffer_get_fd_with_caller((MppBuffer)data[0x62],"rkv_h264d_gen_regs");
    *(int *)(data[100] + 0xac) = iVar1;
    mpp_buffer_write_with_caller((MppBuffer)data[99],0,data + 0x24,0x160,"rkv_h264d_gen_regs");
    iVar1 = mpp_buffer_get_fd_with_caller((MppBuffer)data[0x51],"rkv_h264d_gen_regs");
    *(int *)(data[100] + 300) = iVar1;
    mpp_buffer_sync_end_f((MppBuffer)data[0x61],0,"rkv_h264d_gen_regs");
    mpp_buffer_sync_end_f((MppBuffer)data[0x62],0,"rkv_h264d_gen_regs");
    mpp_buffer_sync_end_f((MppBuffer)data[99],0,"rkv_h264d_gen_regs");
  }
  return MPP_OK;
}

Assistant:

MPP_RET rkv_h264d_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;

    INP_CHECK(ret, NULL == p_hal);

    if (task->dec.flags.parse_err ||
        (task->dec.flags.ref_err && !p_hal->cfg->base.disable_error)) {
        goto __RETURN;
    }
    H264dRkvRegCtx_t *reg_ctx = (H264dRkvRegCtx_t *)p_hal->reg_ctx;
    if (p_hal->fast_mode) {
        RK_U32 i = 0;
        for (i = 0; i <  MPP_ARRAY_ELEMS(reg_ctx->reg_buf); i++) {
            if (!reg_ctx->reg_buf[i].valid) {
                task->dec.reg_index = i;
                reg_ctx->spspps_buf = reg_ctx->reg_buf[i].spspps;
                reg_ctx->rps_buf = reg_ctx->reg_buf[i].rps;
                reg_ctx->sclst_buf = reg_ctx->reg_buf[i].sclst;
                reg_ctx->regs = reg_ctx->reg_buf[i].regs;
                reg_ctx->reg_buf[i].valid = 1;
                break;
            }
        }
    }

    prepare_spspps(p_hal, (RK_U64 *)&reg_ctx->spspps, sizeof(reg_ctx->spspps));
    prepare_framerps(p_hal, (RK_U64 *)&reg_ctx->rps, sizeof(reg_ctx->rps));
    prepare_scanlist(p_hal, (RK_U64 *)&reg_ctx->sclst, sizeof(reg_ctx->sclst));
    set_registers(p_hal, reg_ctx->regs, task);

    //!< copy datas
    RK_U32 i = 0;
    for (i = 0; i < 256; i++) {
        mpp_buffer_write(reg_ctx->spspps_buf,
                         (sizeof(reg_ctx->spspps) * i), (void *)reg_ctx->spspps,
                         sizeof(reg_ctx->spspps));
    }
    reg_ctx->regs->sw42.pps_base = mpp_buffer_get_fd(reg_ctx->spspps_buf);

    mpp_buffer_write(reg_ctx->rps_buf, 0,
                     (void *)reg_ctx->rps, sizeof(reg_ctx->rps));
    reg_ctx->regs->sw43.rps_base = mpp_buffer_get_fd(reg_ctx->rps_buf);

    mpp_buffer_write(reg_ctx->sclst_buf, 0,
                     (void *)reg_ctx->sclst, sizeof(reg_ctx->sclst));
    reg_ctx->regs->sw75.errorinfo_base = mpp_buffer_get_fd(reg_ctx->errinfo_buf);
    mpp_buffer_sync_end(reg_ctx->spspps_buf);
    mpp_buffer_sync_end(reg_ctx->rps_buf);
    mpp_buffer_sync_end(reg_ctx->sclst_buf);

__RETURN:
    return ret = MPP_OK;
}